

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::changeEvent(QTextEdit *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QTextEditPrivate *this_00;
  QTextDocument *pQVar3;
  QEvent *in_RSI;
  QWidget *in_RDI;
  QWidget *in_stack_00000008;
  QTextEditPrivate *d;
  QPalette *in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffc0;
  QWidget *this_01;
  QEvent *in_stack_ffffffffffffffc8;
  QFrame *in_stack_ffffffffffffffd0;
  
  this_00 = d_func((QTextEdit *)0x6d4f21);
  QFrame::changeEvent(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  TVar2 = QEvent::type(in_RSI);
  if ((TVar2 == ApplicationFontChange) || (TVar2 = QEvent::type(in_RSI), TVar2 == FontChange)) {
    pQVar3 = QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffffc0);
    QWidget::font(in_RDI);
    QTextDocument::setDefaultFont((QFont *)pQVar3);
  }
  else {
    TVar2 = QEvent::type(in_RSI);
    if (TVar2 == ActivationChange) {
      bVar1 = QWidget::isActiveWindow(in_stack_00000008);
      if (!bVar1) {
        QBasicTimer::stop();
      }
    }
    else {
      TVar2 = QEvent::type(in_RSI);
      if (TVar2 == EnabledChange) {
        bVar1 = QWidget::isEnabled((QWidget *)0x6d4fdb);
        (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
        QWidget::palette(in_stack_ffffffffffffffc0);
        QWidgetTextControl::setPalette
                  ((QWidgetTextControl *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        QTextEditPrivate::sendControlEvent(this_00,(QEvent *)in_RDI);
      }
      else {
        TVar2 = QEvent::type(in_RSI);
        if (TVar2 == PaletteChange) {
          this_01 = (QWidget *)this_00->control;
          QWidget::palette(this_01);
          QWidgetTextControl::setPalette((QWidgetTextControl *)this_01,in_stack_ffffffffffffffb8);
        }
        else {
          TVar2 = QEvent::type(in_RSI);
          if (TVar2 == LayoutDirectionChange) {
            QTextEditPrivate::sendControlEvent(this_00,(QEvent *)in_RDI);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void QTextEdit::changeEvent(QEvent *e)
{
    Q_D(QTextEdit);
    QAbstractScrollArea::changeEvent(e);
    if (e->type() == QEvent::ApplicationFontChange
        || e->type() == QEvent::FontChange) {
        d->control->document()->setDefaultFont(font());
    }  else if (e->type() == QEvent::ActivationChange) {
        if (!isActiveWindow())
            d->autoScrollTimer.stop();
    } else if (e->type() == QEvent::EnabledChange) {
        e->setAccepted(isEnabled());
        d->control->setPalette(palette());
        d->sendControlEvent(e);
    } else if (e->type() == QEvent::PaletteChange) {
        d->control->setPalette(palette());
    } else if (e->type() == QEvent::LayoutDirectionChange) {
        d->sendControlEvent(e);
    }
}